

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O3

void dic_resize(dictionary *dic,int newsize)

{
  int iVar1;
  keynode **__ptr;
  keynode *pkVar2;
  keynode *k2;
  keynode **ppkVar3;
  long lVar4;
  
  iVar1 = dic->length;
  __ptr = dic->table;
  ppkVar3 = (keynode **)calloc(8,(long)newsize);
  dic->table = ppkVar3;
  dic->length = newsize;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      k2 = __ptr[lVar4];
      while (k2 != (keynode *)0x0) {
        pkVar2 = k2->next;
        k2->next = (keynode *)0x0;
        dic_reinsert_when_resizing(dic,k2);
        k2 = pkVar2;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != iVar1);
  }
  free(__ptr);
  return;
}

Assistant:

void dic_resize(struct dictionary* dic, int newsize) {
	int o = dic->length;
	struct keynode **old = dic->table;
	dic->table = calloc(sizeof(struct keynode*), newsize);
	dic->length = newsize;
	for (int i = 0; i < o; i++) {
		struct keynode *k = old[i];
		while (k) {
			struct keynode *next = k->next;
			k->next = 0;
			dic_reinsert_when_resizing(dic, k);
			k = next;
		}
	}
	free(old);
}